

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_klass.hpp
# Opt level: O0

Klass<Foo,_void> * __thiscall
squall::Klass<Foo,void>::func<int(Foo::*)(std::__cxx11::string_const&)>
          (Klass<Foo,void> *this,string *name,offset_in_Foo_to_subr f)

{
  string *name_00;
  HSQUIRRELVM vm;
  element_type *peVar1;
  offset_in_Foo_to_subr in_RCX;
  function<int_(Foo_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_88;
  shared_ptr<squall::detail::KlassImp<Foo>_> local_58;
  HSQOBJECT local_48;
  squall *local_38;
  offset_in_Foo_to_subr f_local;
  string *local_28;
  string *name_local;
  Klass<Foo,_void> *this_local;
  
  local_38 = (squall *)f;
  f_local = in_RCX;
  local_28 = name;
  name_local = (string *)this;
  this_local = (Klass<Foo,_void> *)f;
  vm = VM::handle(*(VM **)this);
  std::weak_ptr<squall::detail::KlassImp<Foo>_>::lock
            ((weak_ptr<squall::detail::KlassImp<Foo>_> *)&local_58);
  peVar1 = std::
           __shared_ptr_access<squall::detail::KlassImp<Foo>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<squall::detail::KlassImp<Foo>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_58);
  local_48._type = (*(peVar1->super_KlassImpBase)._vptr_KlassImpBase[3])();
  name_00 = local_28;
  to_function<int(Foo::*)(std::__cxx11::string_const&)>(&local_88,local_38,f_local);
  detail::defun_local<int,Foo*,std::__cxx11::string_const&>(vm,&local_48,name_00,&local_88);
  std::
  function<int_(Foo_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_88);
  std::shared_ptr<squall::detail::KlassImp<Foo>_>::~shared_ptr(&local_58);
  return (Klass<Foo,_void> *)this;
}

Assistant:

Klass<C, Base>& func(const string& name, F f) {
        detail::defun_local(
            vm_.handle(),
            imp_.lock()->get_klass_object(),
            name,
            to_function(f));
        return *this;
    }